

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_lowbd_inv_txfm2d_add_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  int32_t *in_RSI;
  undefined1 in_R8B;
  int in_R9D;
  int in_stack_0000009c;
  TX_SIZE in_stack_000000a2;
  TX_TYPE in_stack_000000a3;
  int in_stack_000000a4;
  uint8_t *in_stack_000000a8;
  int32_t *in_stack_000000b0;
  int in_stack_000000dc;
  TX_SIZE in_stack_000000e2;
  TX_TYPE in_stack_000000e3;
  int in_stack_000000e4;
  uint8_t *in_stack_000000e8;
  int32_t *in_stack_000000f0;
  int in_stack_0000011c;
  TX_SIZE in_stack_00000122;
  TX_TYPE in_stack_00000123;
  int in_stack_00000124;
  uint8_t *in_stack_00000128;
  int32_t *in_stack_00000130;
  int in_stack_0000022c;
  TX_SIZE in_stack_00000232;
  TX_TYPE in_stack_00000233;
  int in_stack_00000234;
  uint8_t *in_stack_00000238;
  int32_t *in_stack_00000240;
  int in_stack_000002ac;
  TX_SIZE in_stack_000002b2;
  TX_TYPE in_stack_000002b3;
  int in_stack_000002b4;
  uint8_t *in_stack_000002b8;
  int32_t *in_stack_000002c0;
  TX_SIZE in_stack_ffffffffffffffe2;
  TX_TYPE in_stack_ffffffffffffffe3;
  undefined2 in_stack_ffffffffffffffe8;
  
  switch(in_R8B) {
  case 0:
    lowbd_inv_txfm2d_add_4x4_ssse3
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3,
               in_stack_000000a2,in_stack_0000009c);
    break;
  default:
    lowbd_inv_txfm2d_add_universe_ssse3
              (in_RSI,(uint8_t *)
                      CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8))),
               in_R9D,in_stack_ffffffffffffffe3,in_stack_ffffffffffffffe2,0);
    break;
  case 5:
    lowbd_inv_txfm2d_add_4x8_ssse3
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e3,
               in_stack_000000e2,in_stack_000000dc);
    break;
  case 6:
    lowbd_inv_txfm2d_add_8x4_ssse3
              (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000123,
               in_stack_00000122,in_stack_0000011c);
    break;
  case 0xd:
    lowbd_inv_txfm2d_add_4x16_ssse3
              (in_stack_00000240,in_stack_00000238,in_stack_00000234,in_stack_00000233,
               in_stack_00000232,in_stack_0000022c);
    break;
  case 0xe:
    lowbd_inv_txfm2d_add_16x4_ssse3
              (in_stack_000002c0,in_stack_000002b8,in_stack_000002b4,in_stack_000002b3,
               in_stack_000002b2,in_stack_000002ac);
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_ssse3(const int32_t *input, uint8_t *output,
                                    int stride, TX_TYPE tx_type,
                                    TX_SIZE tx_size, int eob) {
  switch (tx_size) {
    case TX_4X4:
      lowbd_inv_txfm2d_add_4x4_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_4X8:
      lowbd_inv_txfm2d_add_4x8_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X4:
      lowbd_inv_txfm2d_add_8x4_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_4X16:
      lowbd_inv_txfm2d_add_4x16_ssse3(input, output, stride, tx_type, tx_size,
                                      eob);
      break;
    case TX_16X4:
      lowbd_inv_txfm2d_add_16x4_ssse3(input, output, stride, tx_type, tx_size,
                                      eob);
      break;
    default:
      lowbd_inv_txfm2d_add_universe_ssse3(input, output, stride, tx_type,
                                          tx_size, eob);
      break;
  }
}